

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O0

void __thiscall Pl_String::~Pl_String(Pl_String *this)

{
  Pl_String *this_local;
  
  ~Pl_String(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_String::~Pl_String() = default;